

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_identitySet_primitive_scanFor
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  intptr_t value;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  value = sysbvm_identitySet_scanFor(*arguments,arguments[1]);
  sVar1 = sysbvm_tuple_intptr_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_identitySet_primitive_scanFor(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    return sysbvm_tuple_intptr_encode(context, sysbvm_identitySet_scanFor(arguments[0], arguments[1]));
}